

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitap.hpp
# Opt level: O0

iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall
burst::algorithm::bitap<char,std::bitset<32ul>,std::array<std::bitset<32ul>,256ul>>::
active_search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (bitap<char,std::bitset<32ul>,std::array<std::bitset<32ul>,256ul>> *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          match_candidate,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          corpus_current,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          corpus_end,bitmask_type *hint)

{
  bool bVar1;
  element_type *peVar2;
  size_t sVar3;
  reference pcVar4;
  bool local_c1;
  bitset<32UL> local_98;
  _Base_bitset<1UL> local_90;
  _Base_bitset<1UL> local_88;
  _Base_bitset<1UL> local_80;
  _Base_bitset<1UL> local_78;
  _Base_bitset<1UL> local_70;
  bitset<32UL> local_68;
  _Base_bitset<1UL> local_60;
  _Base_bitset<1UL> local_58;
  bitmask_type *match_column;
  _Base_bitset<1UL> local_48;
  bitset<32UL> match_indicator;
  bitmask_type *hint_local;
  bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_> *this_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  corpus_end_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  corpus_current_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  match_candidate_local;
  
  match_indicator.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)hint;
  this_local = (bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_> *)
               corpus_end._M_current;
  corpus_end_local = corpus_current;
  corpus_current_local = match_candidate;
  std::bitset<32UL>::bitset((bitset<32UL> *)&match_column,1);
  peVar2 = std::
           __shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  sVar3 = algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>::
          length(peVar2);
  local_48._M_w =
       (_WordT)left_shift<std::bitset<32ul>,unsigned_long>((bitset<32UL>)match_column,sVar3 - 1);
  local_58 = match_indicator.super__Base_bitset<1UL>._M_w;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&corpus_end_local,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&this_local);
    local_c1 = false;
    if (bVar1) {
      local_60._M_w = (_WordT)std::operator&(local_58._M_w,(bitset<32UL> *)&local_48);
      std::bitset<32UL>::bitset(&local_68,0);
      local_c1 = std::bitset<32UL>::operator==((bitset<32UL> *)&local_60,&local_68);
    }
    if (local_c1 == false) break;
    local_80._M_w = ((_Base_bitset<1UL> *)local_58._M_w)->_M_w;
    local_78._M_w =
         (_WordT)bitap<char,_std::bitset<32UL>,_std::array<std::bitset<32UL>,_256UL>_>::bit_shift
                           (local_80._M_w);
    peVar2 = std::
             __shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_burst::algorithm::detail::element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    pcVar4 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&corpus_end_local);
    local_88._M_w =
         (_WordT)algorithm::detail::
                 element_position_bitmask_table<std::array<std::bitset<32UL>,_256UL>_>::
                 operator[]<char>(peVar2,*pcVar4);
    local_70._M_w = (_WordT)std::operator&((bitset<32UL> *)&local_78,(bitset<32UL> *)&local_88);
    ((_Base_bitset<1UL> *)local_58._M_w)->_M_w = local_70._M_w;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&corpus_end_local);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&corpus_current_local);
  }
  local_90._M_w = (_WordT)std::operator&(local_58._M_w,(bitset<32UL> *)&local_48);
  std::bitset<32UL>::bitset(&local_98,0);
  bVar1 = std::bitset<32UL>::operator==((bitset<32UL> *)&local_90,&local_98);
  if (bVar1) {
    _match_candidate_local =
         (iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
          )boost::make_iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                     ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )this_local,
                      (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )this_local);
  }
  else {
    _match_candidate_local =
         (iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
          )boost::make_iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                     (corpus_current_local,corpus_end_local);
  }
  return (iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
          )(iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
            )_match_candidate_local;
}

Assistant:

boost::iterator_range<ForwardIterator>
                active_search
                (
                    ForwardIterator match_candidate,
                    ForwardIterator corpus_current,
                    ForwardIterator corpus_end,
                    bitmask_type & hint
                ) const
            {
                // Индикатор совпадения — единица на N-м месте в битовой маске,
                // где N — количество элементов в искомом образце.
                const auto match_indicator =
                    left_shift(bitmask_type{0b1}, m_bitmask_table->length() - 1u);
                auto & match_column = hint;

                while (corpus_current != corpus_end && (match_column & match_indicator) == 0)
                {
                    match_column = bit_shift(match_column) & (*m_bitmask_table)[*corpus_current];
                    ++corpus_current;
                    ++match_candidate;
                }

                return (match_column & match_indicator) == 0
                    ? boost::make_iterator_range(corpus_end, corpus_end)
                    : boost::make_iterator_range(match_candidate, corpus_current);
            }